

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OjaNewton.cc
# Opt level: O3

void __thiscall OjaNewton::check(OjaNewton *this)

{
  sparse_parameters *psVar1;
  uint uVar2;
  vw *pvVar3;
  _func_void_weight_ptr_void_ptr *p_Var4;
  bool bVar5;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> _Var6;
  ulong uVar7;
  weight *pwVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  uint32_t i;
  weight wVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  uint64_t index;
  ulong local_48;
  ulong local_40;
  float *local_38;
  
  uVar2 = this->m;
  uVar7 = (ulong)uVar2;
  if (0 < (int)uVar2) {
    dVar15 = 0.0;
    lVar9 = 1;
    lVar11 = 0;
    lVar12 = uVar7 + 1;
    do {
      lVar13 = 1;
      do {
        dVar16 = (double)ABS(*(float *)((long)this->K[lVar9] + lVar13 * 4 + lVar11));
        dVar17 = dVar16;
        if (dVar16 <= dVar15) {
          dVar17 = dVar15;
        }
        dVar15 = (double)(~-(ulong)NAN(dVar15) & (ulong)dVar17 | -(ulong)NAN(dVar15) & (ulong)dVar16
                         );
        lVar13 = lVar13 + 1;
      } while (lVar12 != lVar13);
      lVar9 = lVar9 + 1;
      lVar11 = lVar11 + 4;
      lVar12 = lVar12 + -1;
    } while (lVar9 != uVar7 + 1);
    if (10000000.0 <= dVar15) {
      if (0 < (int)uVar2) {
        lVar12 = 1;
        do {
          memset(this->tmp,0,(long)(int)uVar7 * 8 + 8);
          uVar7 = (ulong)(uint)this->m;
          if (this->m < 1) {
LAB_0022988f:
            lVar9 = (long)(int)uVar7;
          }
          else {
            lVar9 = 1;
            do {
              if ((int)uVar7 < 1) {
                lVar11 = (long)(int)uVar7;
              }
              else {
                lVar13 = 0;
                do {
                  this->tmp[lVar9] =
                       this->A[lVar9][lVar13 + 1] * this->K[lVar13 + 1][lVar12] + this->tmp[lVar9];
                  uVar7 = (ulong)(uint)this->m;
                  lVar11 = (long)this->m;
                  lVar13 = lVar13 + 1;
                } while (lVar13 < lVar11);
              }
              bVar5 = lVar9 < lVar11;
              lVar9 = lVar9 + 1;
            } while (bVar5);
            if ((int)uVar7 < 1) goto LAB_0022988f;
            lVar11 = 0;
            do {
              this->K[lVar11 + 1][lVar12] = this->tmp[lVar11 + 1];
              uVar7 = (ulong)(uint)this->m;
              lVar9 = (long)this->m;
              lVar11 = lVar11 + 1;
            } while (lVar11 < lVar9);
          }
          bVar5 = lVar12 < lVar9;
          lVar12 = lVar12 + 1;
        } while (bVar5);
        if (0 < (int)uVar7) {
          lVar12 = 1;
          do {
            memset(this->tmp,0,(long)(int)uVar7 * 8 + 8);
            uVar7 = (ulong)(uint)this->m;
            if (this->m < 1) {
LAB_00229952:
              lVar9 = (long)(int)uVar7;
            }
            else {
              lVar9 = 1;
              do {
                if ((int)uVar7 < 1) {
                  lVar11 = (long)(int)uVar7;
                }
                else {
                  lVar13 = 0;
                  do {
                    this->tmp[lVar9] =
                         this->K[lVar12][lVar13 + 1] * this->A[lVar9][lVar13 + 1] + this->tmp[lVar9]
                    ;
                    uVar7 = (ulong)(uint)this->m;
                    lVar11 = (long)this->m;
                    lVar13 = lVar13 + 1;
                  } while (lVar13 < lVar11);
                }
                bVar5 = lVar9 < lVar11;
                lVar9 = lVar9 + 1;
              } while (bVar5);
              if ((int)uVar7 < 1) goto LAB_00229952;
              lVar11 = 0;
              do {
                this->K[lVar12][lVar11 + 1] = this->tmp[lVar11 + 1];
                uVar7 = (ulong)(uint)this->m;
                lVar9 = (long)this->m;
                lVar11 = lVar11 + 1;
              } while (lVar11 < lVar9);
            }
            bVar5 = lVar12 < lVar9;
            lVar12 = lVar12 + 1;
          } while (bVar5);
        }
      }
      lVar12 = 1L << ((byte)this->all->num_bits & 0x3f);
      lVar9 = 0;
      do {
        pvVar3 = this->all;
        if ((pvVar3->weights).sparse == true) {
          psVar1 = &(pvVar3->weights).sparse_weights;
          local_48 = lVar9 << ((byte)(pvVar3->weights).sparse_weights._stride_shift & 0x3f) &
                     (pvVar3->weights).sparse_weights._weight_mask;
          _Var6._M_cur = (__node_type *)
                         std::
                         _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                 *)psVar1,&local_48);
          if (_Var6._M_cur == (__node_type *)0x0) {
            local_38 = calloc_or_throw<float>
                                 (1L << ((byte)(pvVar3->weights).sparse_weights._stride_shift & 0x3f
                                        ));
            local_40 = local_48;
            std::
            _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::_M_emplace<std::pair<unsigned_long,float*>>
                      ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)psVar1,&local_40);
            _Var6._M_cur = (__node_type *)
                           std::
                           _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                   *)psVar1,&local_48);
            p_Var4 = (pvVar3->weights).sparse_weights.fun;
            if (p_Var4 != (_func_void_weight_ptr_void_ptr *)0x0) {
              (*p_Var4)(*(weight **)((long)_Var6._M_cur + 0x10),
                        (pvVar3->weights).sparse_weights.default_data);
            }
          }
          pwVar8 = *(weight **)
                    ((long)&((_Var6._M_cur)->
                            super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>).
                            super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>.
                            _M_storage._M_storage + 8);
          uVar7 = (ulong)(uint)this->m;
        }
        else {
          pwVar8 = (pvVar3->weights).dense_weights._begin +
                   (lVar9 << ((byte)(pvVar3->weights).dense_weights._stride_shift & 0x3f) &
                   (pvVar3->weights).dense_weights._weight_mask);
        }
        if (0 < (int)uVar7) {
          wVar14 = *pwVar8;
          lVar11 = 0;
          do {
            wVar14 = wVar14 + pwVar8[lVar11 + 1] * this->b[lVar11 + 1] * this->D[lVar11 + 1];
            *pwVar8 = wVar14;
            uVar7 = (ulong)this->m;
            lVar11 = lVar11 + 1;
          } while (lVar11 < (long)uVar7);
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != lVar12);
      lVar9 = 0;
      memset(this->b,0,(long)(int)uVar7 * 8 + 8);
      uVar7 = (ulong)(uint)this->m;
      do {
        memset(this->tmp,0,(long)(int)uVar7 * 4 + 4);
        pvVar3 = this->all;
        if ((pvVar3->weights).sparse == true) {
          psVar1 = &(pvVar3->weights).sparse_weights;
          local_48 = lVar9 << ((byte)(pvVar3->weights).sparse_weights._stride_shift & 0x3f) &
                     (pvVar3->weights).sparse_weights._weight_mask;
          _Var6._M_cur = (__node_type *)
                         std::
                         _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                 *)psVar1,&local_48);
          if (_Var6._M_cur == (__node_type *)0x0) {
            local_38 = calloc_or_throw<float>
                                 (1L << ((byte)(pvVar3->weights).sparse_weights._stride_shift & 0x3f
                                        ));
            local_40 = local_48;
            std::
            _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::_M_emplace<std::pair<unsigned_long,float*>>
                      ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)psVar1,&local_40);
            _Var6._M_cur = (__node_type *)
                           std::
                           _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                   *)psVar1,&local_48);
            p_Var4 = (pvVar3->weights).sparse_weights.fun;
            if (p_Var4 != (_func_void_weight_ptr_void_ptr *)0x0) {
              (*p_Var4)(*(weight **)((long)_Var6._M_cur + 0x10),
                        (pvVar3->weights).sparse_weights.default_data);
            }
          }
          pwVar8 = *(weight **)
                    ((long)&((_Var6._M_cur)->
                            super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>).
                            super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>.
                            _M_storage._M_storage + 8);
        }
        else {
          pwVar8 = (pvVar3->weights).dense_weights._begin +
                   (lVar9 << ((byte)(pvVar3->weights).dense_weights._stride_shift & 0x3f) &
                   (pvVar3->weights).dense_weights._weight_mask);
        }
        uVar7 = (ulong)(uint)this->m;
        if (0 < this->m) {
          lVar11 = 1;
          do {
            if ((int)uVar7 < 1) {
              lVar13 = (long)(int)uVar7;
            }
            else {
              lVar10 = 0;
              do {
                this->tmp[lVar11] =
                     this->A[lVar11][lVar10 + 1] * this->D[lVar10 + 1] * pwVar8[lVar10 + 1] +
                     this->tmp[lVar11];
                uVar7 = (ulong)(uint)this->m;
                lVar13 = (long)this->m;
                lVar10 = lVar10 + 1;
              } while (lVar10 < lVar13);
            }
            bVar5 = lVar11 < lVar13;
            lVar11 = lVar11 + 1;
          } while (bVar5);
          if (0 < (int)uVar7) {
            lVar11 = 0;
            do {
              pwVar8[lVar11 + 1] = this->tmp[lVar11 + 1];
              uVar7 = (ulong)this->m;
              lVar11 = lVar11 + 1;
            } while (lVar11 < (long)uVar7);
          }
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != lVar12);
      if (0 < (int)uVar7) {
        lVar12 = 0;
        do {
          memset(this->A[lVar12 + 1],0,(long)(int)uVar7 * 8 + 8);
          this->D[lVar12 + 1] = 1.0;
          this->A[lVar12 + 1][lVar12 + 1] = 1.0;
          uVar7 = (ulong)this->m;
          lVar12 = lVar12 + 1;
        } while (lVar12 < (long)uVar7);
      }
    }
  }
  return;
}

Assistant:

void check()
  {
    double max_norm = 0;
    for (int i = 1; i <= m; i++)
      for (int j = i; j <= m; j++) max_norm = fmax(max_norm, fabs(K[i][j]));
    // printf("|K| = %f\n", max_norm);
    if (max_norm < 1e7)
      return;

    // implicit -> explicit representation
    // printf("begin conversion: t = %d, norm(K) = %f\n", t, max_norm);

    // first step: K <- AKA'

    // K <- AK
    for (int j = 1; j <= m; j++)
    {
      memset(tmp, 0, sizeof(double) * (m + 1));

      for (int i = 1; i <= m; i++)
      {
        for (int h = 1; h <= m; h++)
        {
          tmp[i] += A[i][h] * K[h][j];
        }
      }

      for (int i = 1; i <= m; i++) K[i][j] = tmp[i];
    }
    // K <- KA'
    for (int i = 1; i <= m; i++)
    {
      memset(tmp, 0, sizeof(double) * (m + 1));

      for (int j = 1; j <= m; j++)
        for (int h = 1; h <= m; h++) tmp[j] += K[i][h] * A[j][h];

      for (int j = 1; j <= m; j++)
      {
        K[i][j] = tmp[j];
      }
    }

    // second step: w[0] <- w[0] + (DZ)'b, b <- 0.

    uint32_t length = 1 << all->num_bits;
    for (uint32_t i = 0; i < length; i++)
    {
      weight& w = all->weights.strided_index(i);
      for (int j = 1; j <= m; j++) w += (&w)[j] * b[j] * D[j];
    }

    memset(b, 0, sizeof(double) * (m + 1));

    // third step: Z <- ADZ, A, D <- Identity

    // double norm = 0;
    for (uint32_t i = 0; i < length; ++i)
    {
      memset(tmp, 0, sizeof(float) * (m + 1));
      weight& w = all->weights.strided_index(i);
      for (int j = 1; j <= m; j++)
      {
        for (int h = 1; h <= m; ++h) tmp[j] += A[j][h] * D[h] * (&w)[h];
      }
      for (int j = 1; j <= m; ++j)
      {
        // norm = max(norm, fabs(tmp[j]));
        (&w)[j] = tmp[j];
      }
    }
    // printf("|Z| = %f\n", norm);

    for (int i = 1; i <= m; i++)
    {
      memset(A[i], 0, sizeof(double) * (m + 1));
      D[i] = 1;
      A[i][i] = 1;
    }
  }